

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

void cargo_destroy(cargo_t *ctx)

{
  cargo_t ctx_00;
  cargo_t c;
  cargo_opt_t *opt;
  size_t i;
  cargo_t *ctx_local;
  
  if (ctx != (cargo_t *)0x0) {
    ctx_00 = *ctx;
    if ((ctx_00->flags & CARGO_AUTOCLEAN) != 0) {
      _cargo_cleanup_option_values(ctx_00,1);
    }
    if (ctx_00->options != (cargo_opt_t *)0x0) {
      for (opt = (cargo_opt_t *)0x0; opt < (cargo_opt_t *)ctx_00->opt_count;
          opt = (cargo_opt_t *)((long)opt->name + 1)) {
        _cargo_option_destroy(ctx_00->options + (long)opt);
      }
      _cargo_xfree(&ctx_00->options);
    }
    _cargo_groups_destroy(ctx_00);
    _cargo_free_str_list(&ctx_00->args,(size_t *)0x0);
    _cargo_free_str_list(&ctx_00->unknown_opts,(size_t *)0x0);
    _cargo_xfree(&ctx_00->unknown_opts_idxs);
    _cargo_xfree(&ctx_00->error);
    _cargo_xfree(&ctx_00->short_usage);
    _cargo_xfree(&ctx_00->usage);
    _cargo_xfree(&ctx_00->description);
    _cargo_xfree(&ctx_00->epilog);
    _cargo_xfree(ctx_00);
    _cargo_free(*ctx);
  }
  return;
}

Assistant:

void cargo_destroy(cargo_t *ctx)
{
    size_t i;

    CARGODBG(2, "cargo_destroy: DESTROY!\n");

    if (ctx)
    {
        cargo_opt_t *opt;
        cargo_t c = *ctx;

        if (c->flags & CARGO_AUTOCLEAN)
        {
            CARGODBG(2, "Auto clean target values\n");
            _cargo_cleanup_option_values(c, 1);
        }

        if (c->options)
        {
            CARGODBG(2, "DESTROY %lu options!\n", c->opt_count);

            for (i = 0; i < c->opt_count; i++)
            {
                opt = &c->options[i];
                CARGODBG(2, "Free opt: %s\n", opt->name[0]);
                _cargo_option_destroy(opt);
            }

            _cargo_xfree(&c->options);
        }

        _cargo_groups_destroy(c);

        _cargo_free_str_list(&c->args, NULL);
        _cargo_free_str_list(&c->unknown_opts, NULL);

        _cargo_xfree(&c->unknown_opts_idxs);
        _cargo_xfree(&c->error);
        _cargo_xfree(&c->short_usage);
        _cargo_xfree(&c->usage);
        _cargo_xfree(&c->description);
        _cargo_xfree(&c->epilog);
        _cargo_xfree(&c->progname);

        _cargo_free(*ctx);
        ctx = NULL;
    }
}